

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,char *s)

{
  CBStringException *pCVar1;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  CBStringException bstr__cppwrapper_exception_2;
  string local_c8;
  undefined1 local_a8 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  size_t tmpSlen;
  char *s_local;
  CBString *this_local;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"CBString::Write protection error",&local_69);
    CBStringException::CBStringException((CBStringException *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_48);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  tmpSlen = (size_t)s;
  if (s == (char *)0x0) {
    tmpSlen = (long)anon_var_dwarf_23d28 + 0x10;
  }
  bstr__cppwrapper_exception.msg.field_2._8_8_ = strlen((char *)tmpSlen);
  if ((ulong)(long)(this->super_tagbstring).mlen <=
      (ulong)bstr__cppwrapper_exception.msg.field_2._8_8_) {
    if (0x7ffffffd < (ulong)bstr__cppwrapper_exception.msg.field_2._8_8_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c8,
                 "CBString::Failure in =(const char *) operator, string too large",
                 (allocator *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
      CBStringException::CBStringException((CBStringException *)local_a8,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
      pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar1,(CBStringException *)local_a8);
      __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    alloc(this,(int)bstr__cppwrapper_exception.msg.field_2._8_8_);
  }
  if ((this->super_tagbstring).data != (uchar *)0x0) {
    (this->super_tagbstring).slen = (int)bstr__cppwrapper_exception.msg.field_2._8_8_;
    memcpy((this->super_tagbstring).data,(void *)tmpSlen,
           bstr__cppwrapper_exception.msg.field_2._8_8_ + 1);
    return this;
  }
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).mlen = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"CBString::Failure in =(const char *) operator",&local_119);
  CBStringException::CBStringException((CBStringException *)local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar1,(CBStringException *)local_f8);
  __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (const char *s) {
size_t tmpSlen;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (NULL == s) s = "";
	if ((tmpSlen = strlen (s)) >= (size_t) mlen) {
		if (tmpSlen >= INT_MAX-1) bstringThrow ("Failure in =(const char *) operator, string too large");
		alloc ((int) tmpSlen);
	}

	if (data) {
		slen = (int) tmpSlen;
		bstr__memcpy (data, s, tmpSlen + 1);
	} else {
		mlen = slen = 0;
		bstringThrow ("Failure in =(const char *) operator");
	}
	return *this;
}